

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

monst * christen_monst(monst *mtmp,char *name)

{
  size_t sVar1;
  uint local_7c;
  char local_78 [8];
  char buf [63];
  monst *mtmp2;
  char *pcStack_20;
  int lth;
  char *name_local;
  monst *mtmp_local;
  
  if (*name == '\0') {
    local_7c = 0;
  }
  else {
    sVar1 = strlen(name);
    local_7c = (int)sVar1 + 1;
  }
  mtmp2._4_4_ = local_7c;
  pcStack_20 = name;
  if (0x3f < (int)local_7c) {
    mtmp2._4_4_ = 0x3f;
    pcStack_20 = strncpy(local_78,name,0x3e);
    buf[0x36] = '\0';
  }
  if (mtmp2._4_4_ == mtmp->mnamelth) {
    mtmp_local = mtmp;
    if (mtmp2._4_4_ != 0) {
      strcpy((char *)((long)(mtmp->mtrack + 0x18) + (long)(int)mtmp->mxlth),pcStack_20);
    }
  }
  else {
    mtmp_local = newmonst((uint)mtmp->mxtyp,mtmp2._4_4_);
    memcpy(mtmp_local,mtmp,0x78);
    memcpy(&mtmp_local->field_0x74,&mtmp->field_0x74,(long)mtmp->mxlth);
    mtmp_local->mnamelth = (uchar)mtmp2._4_4_;
    if (mtmp2._4_4_ != 0) {
      strcpy((char *)((long)(mtmp_local->mtrack + 0x18) + (long)(int)mtmp_local->mxlth),pcStack_20);
    }
    replmon(mtmp,mtmp_local);
  }
  return mtmp_local;
}

Assistant:

struct monst *christen_monst(struct monst *mtmp, const char *name)
{
	int lth;
	struct monst *mtmp2;
	char buf[PL_PSIZ];

	/* dogname & catname are PL_PSIZ arrays; object names have same limit */
	lth = *name ? (int)(strlen(name) + 1) : 0;
	if (lth > PL_PSIZ){
		lth = PL_PSIZ;
		name = strncpy(buf, name, PL_PSIZ - 1);
		buf[PL_PSIZ - 1] = '\0';
	}
	if (lth == mtmp->mnamelth) {
		/* don't need to allocate a new monst struct */
		if (lth) strcpy(NAME(mtmp), name);
		return mtmp;
	}
	mtmp2 = newmonst(mtmp->mxtyp, lth);
	*mtmp2 = *mtmp;
	memcpy(mtmp2->mextra, mtmp->mextra, mtmp->mxlth);
	mtmp2->mnamelth = lth;
	if (lth) strcpy(NAME(mtmp2), name);
	replmon(mtmp,mtmp2);
	return mtmp2;
}